

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O1

bool Diligent::StreqSuff(char *RefStr,char *Str,char *Suff,bool NoSuffixAllowed)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  bool bVar5;
  undefined7 in_register_00000009;
  char (*Args_1) [36];
  char (*Args_1_00) [8];
  char cVar6;
  string msg;
  string local_48;
  
  Args_1 = (char (*) [36])CONCAT71(in_register_00000009,Str != (char *)0x0);
  if (RefStr == (char *)0x0 || Str == (char *)0x0) {
    FormatString<char[26],char[36]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"RefStr != nullptr && Str != nullptr",Args_1);
    Args_1 = (char (*) [36])0x0;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"StreqSuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringTools.hpp"
               ,0x76);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (RefStr != (char *)0x0) {
    cVar3 = *RefStr;
    Args_1_00 = (char (*) [8])CONCAT71((int7)((ulong)Args_1 >> 8),cVar3 == '\0');
    if ((cVar3 != '\0') && (cVar6 = *Str, cVar6 != '\0')) {
      pcVar1 = Str + 1;
      pcVar2 = RefStr + 1;
      do {
        RefStr = pcVar2;
        Str = pcVar1;
        if (cVar3 != cVar6) {
          return false;
        }
        cVar3 = *RefStr;
        Args_1_00 = (char (*) [8])CONCAT71((int7)((ulong)Args_1_00 >> 8),cVar3 == '\0');
        if (cVar3 == '\0') break;
        cVar6 = *Str;
        pcVar1 = Str + 1;
        pcVar2 = RefStr + 1;
      } while (cVar6 != '\0');
    }
    bVar5 = SUB81(Args_1_00,0);
    if (*Str == '\0') {
      if ((bVar5 & NoSuffixAllowed) != 0) {
        return true;
      }
      if (Suff != (char *)0x0) {
        iVar4 = strcmp(RefStr,Suff);
        return iVar4 == 0;
      }
      return bVar5;
    }
    if (bVar5 == false) {
      FormatString<char[26],char[8]>
                (&local_48,(Diligent *)"Debug expression failed:\n",(char (*) [26])"*r == 0",
                 Args_1_00);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"StreqSuff",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringTools.hpp"
                 ,0x8f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return false;
}

Assistant:

inline bool StreqSuff(const char* RefStr, const char* Str, const char* Suff, bool NoSuffixAllowed = false)
{
    VERIFY_EXPR(RefStr != nullptr && Str != nullptr);
    if (RefStr == nullptr)
        return false;

    const auto* r = RefStr;
    const auto* s = Str;
    // abc_def     abc
    // ^           ^
    // r           s
    for (; *r != 0 && *s != 0; ++r, ++s)
    {
        if (*r != *s)
        {
            // abc_def     abx
            //   ^           ^
            //   r           s
            return false;
        }
    }

    if (*s != 0)
    {
        // ab         abc
        //   ^          ^
        //   r          s
        VERIFY_EXPR(*r == 0);
        return false;
    }
    else
    {
        // abc_def     abc
        //    ^           ^
        //    r           s

        if (NoSuffixAllowed && *r == 0)
        {
            // abc         abc      _def
            //    ^           ^
            //    r           s
            return true;
        }

        if (Suff != nullptr)
        {
            // abc_def     abc       _def
            //    ^           ^      ^
            //    r           s      Suff
            return strcmp(r, Suff) == 0;
        }
        else
        {
            // abc         abc                abc_def         abc
            //    ^           ^       or         ^               ^
            //    r           s                  r               s
            return *r == 0;
        }
    }
}